

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O3

void __thiscall mat<3UL,_3UL>::set_col(mat<3UL,_3UL> *this,size_t idx,vec<3UL,_double> *v)

{
  long lVar1;
  size_t i;
  double *pdVar2;
  bool bVar3;
  double dVar4;
  
  if (idx < 3) {
    lVar1 = (ulong)(idx != 1) * 8 + 8;
    if (idx == 0) {
      lVar1 = 0;
    }
    pdVar2 = (double *)((long)&this->rows[2].x + lVar1);
    i = 2;
    do {
      dVar4 = vec<3UL,_double>::operator[](v,i);
      *pdVar2 = dVar4;
      pdVar2 = pdVar2 + -3;
      bVar3 = i != 0;
      i = i - 1;
    } while (bVar3);
    return;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xbe,
                "void mat<3, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 3, ncols = 3]"
               );
}

Assistant:

void set_col(const size_t idx, const vec<nrows, double>& v)
    {
        assert(idx >= 0 && idx < ncols);
        for (size_t i = nrows; i--; rows[i][idx] = v[i])
            ;
    }